

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# section.cpp
# Opt level: O2

void insert_or_append_to_polymap
               (map<unsigned_int,_std::vector<co_ord,_std::allocator<co_ord>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::vector<co_ord,_std::allocator<co_ord>_>_>_>_>
                *target_map,int key,co_ord *polygon)

{
  pointer *this;
  size_type sVar1;
  mapped_type *this_00;
  initializer_list<co_ord> __l;
  allocator_type local_61;
  co_ord local_60;
  vector<co_ord,_std::allocator<co_ord>_> polygons;
  
  local_60.x.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start.
  _0_4_ = key;
  sVar1 = std::
          map<unsigned_int,_std::vector<co_ord,_std::allocator<co_ord>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::vector<co_ord,_std::allocator<co_ord>_>_>_>_>
          ::count(target_map,(key_type_conflict *)&local_60);
  if (sVar1 == 0) {
    co_ord::co_ord(&local_60,polygon);
    __l._M_len = 1;
    __l._M_array = &local_60;
    std::vector<co_ord,_std::allocator<co_ord>_>::vector(&polygons,__l,&local_61);
    co_ord::~co_ord(&local_60);
    this = &local_60.x.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
            ._M_finish;
    local_60.x.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_start._0_4_ = key;
    std::vector<co_ord,_std::allocator<co_ord>_>::vector
              ((vector<co_ord,_std::allocator<co_ord>_> *)this,&polygons);
    std::
    _Rb_tree<unsigned_int,std::pair<unsigned_int_const,std::vector<co_ord,std::allocator<co_ord>>>,std::_Select1st<std::pair<unsigned_int_const,std::vector<co_ord,std::allocator<co_ord>>>>,std::less<unsigned_int>,std::allocator<std::pair<unsigned_int_const,std::vector<co_ord,std::allocator<co_ord>>>>>
    ::_M_emplace_unique<std::pair<unsigned_int,std::vector<co_ord,std::allocator<co_ord>>>>
              ((_Rb_tree<unsigned_int,std::pair<unsigned_int_const,std::vector<co_ord,std::allocator<co_ord>>>,std::_Select1st<std::pair<unsigned_int_const,std::vector<co_ord,std::allocator<co_ord>>>>,std::less<unsigned_int>,std::allocator<std::pair<unsigned_int_const,std::vector<co_ord,std::allocator<co_ord>>>>>
                *)target_map,
               (pair<unsigned_int,_std::vector<co_ord,_std::allocator<co_ord>_>_> *)&local_60);
    std::vector<co_ord,_std::allocator<co_ord>_>::~vector
              ((vector<co_ord,_std::allocator<co_ord>_> *)this);
    std::vector<co_ord,_std::allocator<co_ord>_>::~vector(&polygons);
  }
  else {
    local_60.x.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_start._0_4_ = key;
    this_00 = std::
              map<unsigned_int,_std::vector<co_ord,_std::allocator<co_ord>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::vector<co_ord,_std::allocator<co_ord>_>_>_>_>
              ::operator[](target_map,(key_type_conflict *)&local_60);
    std::vector<co_ord,_std::allocator<co_ord>_>::push_back(this_00,polygon);
  }
  return;
}

Assistant:

void insert_or_append_to_polymap(
    std::map<unsigned int, std::vector<co_ord>> &target_map, int key,
    const co_ord &polygon)
{
  if (target_map.count(key) > 0) {
    target_map[key].push_back(polygon);
  } else {
    vector<co_ord> polygons = {polygon};
    target_map.insert(pair<unsigned int, vector<co_ord>>(key, polygons));
  }
}